

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGlobalVC.cxx
# Opt level: O3

bool __thiscall cmCTestGlobalVC::WriteXMLUpdates(cmCTestGlobalVC *this,cmXMLWriter *xml)

{
  cmCTest *pcVar1;
  int iVar2;
  int iVar3;
  _Rb_tree_node_base *p_Var4;
  ostringstream cmCTestLog_msg;
  long *local_1c8;
  long local_1b8 [2];
  long local_1a8 [14];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"   Gathering version information (one . per revision):\n    ",
             0x3b);
  std::ostream::flush();
  pcVar1 = (this->super_cmCTestVC).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestGlobalVC.cxx"
               ,0x6a,(char *)local_1c8,false);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  iVar2 = (*(this->super_cmCTestVC)._vptr_cmCTestVC[0xc])(this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::ios::widen((char)(ostringstream *)local_1a8 + (char)*(undefined8 *)(local_1a8[0] + -0x18));
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  pcVar1 = (this->super_cmCTestVC).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestGlobalVC.cxx"
               ,0x6c,(char *)local_1c8,false);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  iVar3 = (*(this->super_cmCTestVC)._vptr_cmCTestVC[0xb])(this);
  (*(this->super_cmCTestVC)._vptr_cmCTestVC[0xd])(this,xml);
  for (p_Var4 = (this->Dirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->Dirs)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    WriteXMLDirectory(this,xml,(string *)(p_Var4 + 1),(Directory *)(p_Var4 + 2));
  }
  return (bool)((byte)iVar2 & (byte)iVar3);
}

Assistant:

bool cmCTestGlobalVC::WriteXMLUpdates(cmXMLWriter& xml)
{
  bool result = true;
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   Gathering version information (one . per revision):\n"
             "    "
               << std::flush);
  result = this->LoadRevisions() && result;
  cmCTestLog(this->CTest, HANDLER_OUTPUT, std::endl);

  result = this->LoadModifications() && result;

  this->WriteXMLGlobal(xml);

  for (auto const& d : this->Dirs) {
    this->WriteXMLDirectory(xml, d.first, d.second);
  }

  return result;
}